

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * anon_unknown.dwarf_102a0::reductionBarrettPrecomputation(BN *__return_storage_ptr__,BN *mod)

{
  pointer __n;
  size_t sVar1;
  reference pvVar2;
  BN local_80;
  BN local_68;
  allocator<unsigned_short> local_39;
  undefined1 local_38 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> ba;
  size_t rbc;
  BN *mod_local;
  
  sVar1 = BN::digitCount(mod);
  __n = (pointer)(sVar1 * 2 + 1);
  ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __n;
  std::allocator<unsigned_short>::allocator(&local_39);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,(size_type)__n,
             &local_39);
  std::allocator<unsigned_short>::~allocator(&local_39);
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::back
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  *pvVar2 = 1;
  BN::BN(&local_80,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,
         (size_t)ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  BN::operator/(&local_68,&local_80,mod);
  BN::BN(__return_storage_ptr__,&local_68);
  BN::~BN(&local_68);
  BN::~BN(&local_80);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

const BN reductionBarrettPrecomputation(const BN& mod) {
    size_t rbc = mod.digitCount() * 2 + 1;
    vector<bt> ba(rbc);
    ba.back() = 1;
    return move(BN(ba, rbc) / mod);
}